

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O1

void __thiscall
llbuild::buildsystem::ExternalCommand::execute
          (ExternalCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context,
          ResultFn *resultFn)

{
  _Any_data *p_Var1;
  size_type sVar2;
  _Any_data *p_Var3;
  bool bVar4;
  BuildSystemDelegate *pBVar5;
  FileSystem *pFVar6;
  void *pvVar7;
  pointer pcVar8;
  BuildNode *pBVar9;
  pointer ppBVar10;
  char *pcVar11;
  pointer ppBVar12;
  StringRef path;
  StringRef SVar13;
  BuildValue result;
  undefined8 *local_118;
  undefined8 uStack_110;
  code *local_108;
  undefined8 uStack_100;
  void *local_f0;
  QueueJobContext *local_e8;
  _Any_data *local_e0;
  pointer local_d8;
  pointer local_d0;
  undefined1 local_c8 [112];
  undefined8 *local_58;
  undefined8 local_50;
  code *local_48;
  code *local_40;
  char local_38;
  
  pvVar7 = ti.ctx;
  pcVar8 = (pointer)ti.impl;
  if ((this->skipValue).Storage.hasVal != true) {
    if ((this->missingInputKeys).super_SmallVectorImpl<llbuild::buildsystem::BuildKey>.
        super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>.
        super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.super_SmallVectorBase.
        Size != 0) {
      __assert_fail("missingInputKeys.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ExternalCommand.cpp"
                    ,0x189,
                    "virtual void llbuild::buildsystem::ExternalCommand::execute(BuildSystem &, core::TaskInterface, QueueJobContext *, ResultFn)"
                   );
    }
    local_d8 = pcVar8;
    if ((this->canUpdateIfNewer == true) && (this->hasPriorResult == true)) {
      (*(this->super_Command).super_JobDescriptor._vptr_JobDescriptor[0x1b])
                ((BuildValue *)local_c8,this,system,pcVar8,pvVar7);
      bVar4 = canUpdateIfNewerWithResult(this,(BuildValue *)local_c8);
      if (bVar4) {
        if ((resultFn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_001792bd;
        (*resultFn->_M_invoker)((_Any_data *)resultFn,(BuildValue *)local_c8);
        BuildValue::~BuildValue((BuildValue *)local_c8);
        if (bVar4) {
          return;
        }
      }
      else {
        BuildValue::~BuildValue((BuildValue *)local_c8);
      }
    }
    ppBVar12 = (this->super_Command).outputs.
               super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppBVar10 = (this->super_Command).outputs.
               super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_f0 = pvVar7;
    local_e8 = context;
    local_e0 = (_Any_data *)resultFn;
    if (ppBVar12 != ppBVar10) {
      local_d0 = ppBVar10;
      do {
        pBVar9 = *ppBVar12;
        if (pBVar9->type != Virtual) {
          SVar13.Length = 2;
          SVar13.Data = (char *)(pBVar9->super_Node).name._M_string_length;
          SVar13 = llvm::sys::path::parent_path
                             ((path *)(pBVar9->super_Node).name._M_dataplus._M_p,SVar13,
                              (Style)pcVar8);
          sVar2 = (pBVar9->super_Node).name._M_string_length;
          if ((sVar2 != 0) &&
             (pcVar8 = (pBVar9->super_Node).name._M_dataplus._M_p, pcVar8[sVar2 - 1] == '/')) {
            path.Length = 2;
            path.Data = (char *)SVar13.Length;
            SVar13 = llvm::sys::path::parent_path((path *)SVar13.Data,path,(Style)pcVar8);
          }
          pcVar11 = SVar13.Data;
          if (SVar13.Length != 0) {
            pFVar6 = BuildSystem::getFileSystem(system);
            if (pcVar11 == (char *)0x0) {
              local_c8._0_8_ = local_c8 + 0x10;
              local_c8._8_8_ = 0;
              local_c8._16_8_ = local_c8._16_8_ & 0xffffffffffffff00;
            }
            else {
              local_c8._0_8_ = local_c8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_c8,pcVar11,pcVar11 + SVar13.Length);
              ppBVar10 = local_d0;
            }
            (*pFVar6->_vptr_FileSystem[3])(pFVar6,(string *)local_c8);
            if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
              operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
            }
          }
        }
        ppBVar12 = ppBVar12 + 1;
      } while (ppBVar12 != ppBVar10);
    }
    pBVar5 = BuildSystem::getDelegate(system);
    (*pBVar5->_vptr_BuildSystemDelegate[10])(pBVar5,this);
    pcVar8 = local_d8;
    p_Var3 = local_e0;
    pvVar7 = local_f0;
    p_Var1 = (_Any_data *)(local_c8 + 0x20);
    local_c8._16_8_ = local_d8;
    local_c8._24_8_ = local_f0;
    local_c8._32_8_ = 0;
    local_c8._40_8_ = 0;
    local_c8._48_8_ = (code *)0x0;
    local_c8._56_8_ = 0;
    local_c8._0_8_ = this;
    local_c8._8_8_ = system;
    if (*(code **)(local_e0 + 1) != (code *)0x0) {
      (**(code **)(local_e0 + 1))(p_Var1,local_e0,__clone_functor);
      local_c8._56_8_ = *(uint64_t *)((long)p_Var3 + 0x18);
      local_c8._48_8_ = *(undefined8 *)(p_Var3 + 1);
    }
    local_108 = (code *)0x0;
    uStack_100 = 0;
    local_118 = (undefined8 *)0x0;
    uStack_110 = 0;
    local_118 = (undefined8 *)operator_new(0x40);
    *local_118 = local_c8._0_8_;
    local_118[1] = local_c8._8_8_;
    *(undefined4 *)(local_118 + 2) = local_c8._16_4_;
    *(undefined4 *)((long)local_118 + 0x14) = local_c8._20_4_;
    *(undefined4 *)(local_118 + 3) = local_c8._24_4_;
    *(undefined4 *)((long)local_118 + 0x1c) = local_c8._28_4_;
    local_118[4] = 0;
    local_118[5] = 0;
    local_118[6] = 0;
    local_118[7] = local_c8._56_8_;
    if ((code *)local_c8._48_8_ != (code *)0x0) {
      local_118[4] = local_c8._32_8_;
      local_118[5] = local_c8._40_8_;
      local_118[6] = local_c8._48_8_;
      local_c8._48_8_ = (code *)0x0;
      local_c8._56_8_ = 0;
    }
    local_38 = '\x01';
    local_40 = std::
               _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ExternalCommand.cpp:426:48)>
               ::_M_invoke;
    local_50 = uStack_110;
    local_48 = std::
               _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ExternalCommand.cpp:426:48)>
               ::_M_manager;
    local_108 = (code *)0x0;
    uStack_100 = 0;
    local_58 = local_118;
    (*(this->super_Command).super_JobDescriptor._vptr_JobDescriptor[0x1a])
              (this,system,pcVar8,pvVar7,local_e8,&local_58);
    if (local_38 == '\x01') {
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,3);
      }
      local_38 = '\0';
    }
    if (local_108 != (code *)0x0) {
      (*local_108)(&local_118,&local_118,3);
    }
    if ((code *)local_c8._48_8_ != (code *)0x0) {
      (*(code *)local_c8._48_8_)(p_Var1,p_Var1,3);
    }
    return;
  }
  if ((this->missingInputKeys).super_SmallVectorImpl<llbuild::buildsystem::BuildKey>.
      super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>.
      super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.super_SmallVectorBase.
      Size != 0) {
    pBVar5 = BuildSystem::getDelegate(system);
    ppBVar12 = (this->super_Command).outputs.
               super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppBVar12 ==
        (this->super_Command).outputs.
        super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pBVar9 = (BuildNode *)0x0;
    }
    else {
      pBVar9 = *ppBVar12;
    }
    (*pBVar5->_vptr_BuildSystemDelegate[0x10])
              (pBVar5,this,pBVar9,
               (this->missingInputKeys).super_SmallVectorImpl<llbuild::buildsystem::BuildKey>.
               super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>.
               super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.
               super_SmallVectorBase.BeginX,
               (ulong)(this->missingInputKeys).super_SmallVectorImpl<llbuild::buildsystem::BuildKey>
                      .super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>.
                      super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.
                      super_SmallVectorBase.Size);
    pBVar5 = BuildSystem::getDelegate(system);
    (*pBVar5->_vptr_BuildSystemDelegate[6])(pBVar5);
  }
  if ((this->skipValue).Storage.hasVal == false) {
    __assert_fail("Storage.hasVal",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/Optional.h"
                  ,0xb0,
                  "T *llvm::Optional<llbuild::buildsystem::BuildValue>::getPointer() [T = llbuild::buildsystem::BuildValue]"
                 );
  }
  if ((resultFn->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*resultFn->_M_invoker)((_Any_data *)resultFn,(BuildValue *)&this->skipValue);
    return;
  }
LAB_001792bd:
  std::__throw_bad_function_call();
}

Assistant:

void ExternalCommand::execute(BuildSystem& system,
                              core::TaskInterface ti,
                              QueueJobContext* context,
                              ResultFn resultFn) {
  // If this command should be skipped, do nothing.
  if (skipValue.hasValue()) {
    // If this command had a failed input, treat it as having failed.
    if (!missingInputKeys.empty()) {
      system.getDelegate().commandCannotBuildOutputDueToMissingInputs(this,
                         outputs.empty() ? nullptr : outputs[0], missingInputKeys);

      // Report the command failure.
      system.getDelegate().hadCommandFailure();
    }

    resultFn(std::move(skipValue.getValue()));
    return;
  }
  assert(missingInputKeys.empty());

  // If it is legal to simply update the command, then see if we can do so.
  if (canUpdateIfNewer && hasPriorResult) {
    BuildValue result = computeCommandResult(system, ti);
    if (canUpdateIfNewerWithResult(result)) {
      resultFn(std::move(result));
      return;
    }
  }

  // Create the directories for the directories containing file outputs.
  //
  // FIXME: Implement a shared cache for this, to reduce the number of
  // syscalls required to make this happen.
  for (auto* node: outputs) {
    if (!node->isVirtual()) {
      // Attempt to create the directory; we ignore errors here under the
      // assumption the command will diagnose the situation if necessary.
      //
      // FIXME: Need to use the filesystem interfaces.
      auto parent = llvm::sys::path::parent_path(node->getName());
      if (node->getName().endswith("/")) {
        parent = llvm::sys::path::parent_path(parent);
      }
      if (!parent.empty()) {
        (void) system.getFileSystem().createDirectories(parent);
      }
    }
  }
    
  // Invoke the external command.
  system.getDelegate().commandStarted(this);
  executeExternalCommand(system, ti, context, {[this, &system, ti, resultFn](ProcessResult result) mutable {
    system.getDelegate().commandFinished(this, result.status);

    // Process the result.
    switch (result.status) {
    case ProcessStatus::Failed:
      resultFn(BuildValue::makeFailedCommand());
      return;
    case ProcessStatus::Cancelled:
      resultFn(BuildValue::makeCancelledCommand());
      return;
    case ProcessStatus::Succeeded:
      resultFn(computeCommandResult(system, ti));
      return;
    case ProcessStatus::Skipped:
    case ProcessStatus::Unknown:
      // It is illegal to get skipped result at this point.
      break;
    }
    llvm::report_fatal_error("unknown result");
  }});
}